

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json.c
# Opt level: O0

LY_ERR json_print_string(ly_out *out,char *text)

{
  byte bVar1;
  ushort **ppuVar2;
  long lStack_28;
  uchar byte;
  uint64_t i;
  char *text_local;
  ly_out *out_local;
  
  if (text != (char *)0x0) {
    ly_write_(out,"\"",1);
    for (lStack_28 = 0; text[lStack_28] != '\0'; lStack_28 = lStack_28 + 1) {
      bVar1 = text[lStack_28];
      if (bVar1 == 9) {
        ly_print_(out,"\\t");
      }
      else if (bVar1 == 0xd) {
        ly_print_(out,"\\r");
      }
      else if (bVar1 == 0x22) {
        ly_print_(out,"\\\"");
      }
      else if (bVar1 == 0x5c) {
        ly_print_(out,"\\\\");
      }
      else {
        ppuVar2 = __ctype_b_loc();
        if (((*ppuVar2)[(int)(uint)bVar1] & 2) == 0) {
          ly_write_(out,text + lStack_28,1);
        }
        else {
          ly_print_(out,"\\u%.4X",(ulong)bVar1);
        }
      }
    }
    ly_write_(out,"\"",1);
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
json_print_string(struct ly_out *out, const char *text)
{
    uint64_t i;

    if (!text) {
        return LY_SUCCESS;
    }

    ly_write_(out, "\"", 1);
    for (i = 0; text[i]; i++) {
        const unsigned char byte = text[i];

        switch (byte) {
        case '"':
            ly_print_(out, "\\\"");
            break;
        case '\\':
            ly_print_(out, "\\\\");
            break;
        case '\r':
            ly_print_(out, "\\r");
            break;
        case '\t':
            ly_print_(out, "\\t");
            break;
        default:
            if (iscntrl(byte)) {
                /* control character */
                ly_print_(out, "\\u%.4X", byte);
            } else {
                /* printable character (even non-ASCII UTF8) */
                ly_write_(out, &text[i], 1);
            }
            break;
        }
    }
    ly_write_(out, "\"", 1);

    return LY_SUCCESS;
}